

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_RH_OWNER_Unmarshal(TPMI_RH_OWNER *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPM_RC TVar1;
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_RH_OWNER *target_local;
  
  TVar1 = UINT32_Unmarshal(target,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  if (*target != 0x40000001) {
    if (*target != 0x40000007) {
      return 0x84;
    }
    if (flag == 0) {
      return 0x84;
    }
  }
  return 0;
}

Assistant:

TPM_RC
TPMI_RH_OWNER_Unmarshal(TPMI_RH_OWNER *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
        case TPM_RH_OWNER:
            break;
        case TPM_RH_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}